

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86.cpp
# Opt level: O2

int __thiscall ncnn::Mish_x86::forward_inplace(Mish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  undefined1 (*pauVar6) [16];
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar11 = 0;
  uVar10 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar10 = uVar11;
  }
  for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    pvVar2 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pauVar6 = (undefined1 (*) [16])(sVar4 * uVar11 * sVar3 + (long)pvVar2);
    lVar9 = 0;
    for (iVar8 = 0; iVar8 + 3 < iVar7; iVar8 = iVar8 + 4) {
      auVar1 = *pauVar6;
      auVar12 = minps(auVar1,_DAT_005377a0);
      auVar12 = maxps(auVar12,_DAT_005377b0);
      fVar13 = auVar12._0_4_ * 1.442695 + 0.5;
      fVar17 = auVar12._4_4_ * 1.442695 + 0.5;
      fVar18 = auVar12._8_4_ * 1.442695 + 0.5;
      fVar19 = auVar12._12_4_ * 1.442695 + 0.5;
      fVar20 = (float)(int)fVar13;
      fVar21 = (float)(int)fVar17;
      fVar22 = (float)(int)fVar18;
      fVar23 = (float)(int)fVar19;
      fVar20 = fVar20 - (float)(-(uint)(fVar13 < fVar20) & 0x3f800000);
      fVar21 = fVar21 - (float)(-(uint)(fVar17 < fVar21) & 0x3f800000);
      fVar22 = fVar22 - (float)(-(uint)(fVar18 < fVar22) & 0x3f800000);
      fVar23 = fVar23 - (float)(-(uint)(fVar19 < fVar23) & 0x3f800000);
      fVar13 = auVar12._0_4_ - fVar20 * 0.6931472;
      fVar17 = auVar12._4_4_ - fVar21 * 0.6931472;
      fVar18 = auVar12._8_4_ - fVar22 * 0.6931472;
      fVar19 = auVar12._12_4_ - fVar23 * 0.6931472;
      auVar14._0_4_ =
           (float)((int)fVar20 * 0x800000 + 0x3f800000) *
           (fVar13 + 1.0 +
           (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) * fVar13 +
             0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5) * fVar13 * fVar13) + 1.0;
      auVar14._4_4_ =
           (float)((int)fVar21 * 0x800000 + 0x3f800000) *
           (fVar17 + 1.0 +
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17) + 1.0;
      auVar14._8_4_ =
           (float)((int)fVar22 * 0x800000 + 0x3f800000) *
           (fVar18 + 1.0 +
           (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
             0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5) * fVar18 * fVar18) + 1.0;
      auVar14._12_4_ =
           (float)((int)fVar23 * 0x800000 + 0x3f800000) *
           (fVar19 + 1.0 +
           (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
             0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) * fVar19 * fVar19) + 1.0;
      auVar12 = maxps(auVar14,_DAT_00537850);
      fVar13 = (float)(auVar12._0_4_ & 0x807fffff | 0x3f000000);
      fVar18 = (float)(auVar12._4_4_ & 0x807fffff | 0x3f000000);
      fVar20 = (float)(auVar12._8_4_ & 0x807fffff | 0x3f000000);
      fVar22 = (float)(auVar12._12_4_ & 0x807fffff | 0x3f000000);
      fVar17 = fVar13 + -1.0 + (float)(-(uint)(fVar13 < 0.70710677) & (uint)fVar13);
      fVar19 = fVar18 + -1.0 + (float)(-(uint)(fVar18 < 0.70710677) & (uint)fVar18);
      fVar21 = fVar20 + -1.0 + (float)(-(uint)(fVar20 < 0.70710677) & (uint)fVar20);
      fVar23 = fVar22 + -1.0 + (float)(-(uint)(fVar22 < 0.70710677) & (uint)fVar22);
      auVar15._0_4_ =
           ~-(uint)(auVar14._0_4_ <= 0.0) &
           (uint)((((float)(int)((auVar12._0_4_ >> 0x17) - 0x7e) -
                   (float)(-(uint)(fVar13 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar17 +
                  (((((((((fVar17 * 0.070376836 + -0.1151461) * fVar17 + 0.116769984) * fVar17 +
                        -0.12420141) * fVar17 + 0.14249323) * fVar17 + -0.16668057) * fVar17 +
                     0.20000714) * fVar17 + -0.24999994) * fVar17 + 0.3333333) * fVar17 + -0.5) *
                  fVar17 * fVar17) * -2.0);
      auVar15._4_4_ =
           ~-(uint)(auVar14._4_4_ <= 0.0) &
           (uint)((((float)(int)((auVar12._4_4_ >> 0x17) - 0x7e) -
                   (float)(-(uint)(fVar18 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar19 +
                  (((((((((fVar19 * 0.070376836 + -0.1151461) * fVar19 + 0.116769984) * fVar19 +
                        -0.12420141) * fVar19 + 0.14249323) * fVar19 + -0.16668057) * fVar19 +
                     0.20000714) * fVar19 + -0.24999994) * fVar19 + 0.3333333) * fVar19 + -0.5) *
                  fVar19 * fVar19) * -2.0);
      auVar15._8_4_ =
           ~-(uint)(auVar14._8_4_ <= 0.0) &
           (uint)((((float)(int)((auVar12._8_4_ >> 0x17) - 0x7e) -
                   (float)(-(uint)(fVar20 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar21 +
                  (((((((((fVar21 * 0.070376836 + -0.1151461) * fVar21 + 0.116769984) * fVar21 +
                        -0.12420141) * fVar21 + 0.14249323) * fVar21 + -0.16668057) * fVar21 +
                     0.20000714) * fVar21 + -0.24999994) * fVar21 + 0.3333333) * fVar21 + -0.5) *
                  fVar21 * fVar21) * -2.0);
      auVar15._12_4_ =
           ~-(uint)(auVar14._12_4_ <= 0.0) &
           (uint)((((float)(int)((auVar12._12_4_ >> 0x17) - 0x7e) -
                   (float)(-(uint)(fVar22 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar23 +
                  (((((((((fVar23 * 0.070376836 + -0.1151461) * fVar23 + 0.116769984) * fVar23 +
                        -0.12420141) * fVar23 + 0.14249323) * fVar23 + -0.16668057) * fVar23 +
                     0.20000714) * fVar23 + -0.24999994) * fVar23 + 0.3333333) * fVar23 + -0.5) *
                  fVar23 * fVar23) * -2.0);
      auVar12._0_8_ =
           CONCAT44(-(uint)(auVar14._4_4_ <= 0.0),-(uint)(auVar14._0_4_ <= 0.0)) &
           0x7fffffff7fffffff;
      auVar12._8_4_ = -(uint)(auVar14._8_4_ <= 0.0) & 0x7fffffff;
      auVar12._12_4_ = -(uint)(auVar14._12_4_ <= 0.0) & 0x7fffffff;
      auVar12 = minps(auVar12 | auVar15,_DAT_005377a0);
      auVar12 = maxps(auVar12,_DAT_005377b0);
      fVar13 = auVar12._0_4_ * 1.442695 + 0.5;
      fVar17 = auVar12._4_4_ * 1.442695 + 0.5;
      fVar18 = auVar12._8_4_ * 1.442695 + 0.5;
      fVar19 = auVar12._12_4_ * 1.442695 + 0.5;
      fVar20 = (float)(int)fVar13;
      fVar21 = (float)(int)fVar17;
      fVar22 = (float)(int)fVar18;
      fVar23 = (float)(int)fVar19;
      fVar20 = fVar20 - (float)(-(uint)(fVar13 < fVar20) & 0x3f800000);
      fVar21 = fVar21 - (float)(-(uint)(fVar17 < fVar21) & 0x3f800000);
      fVar22 = fVar22 - (float)(-(uint)(fVar18 < fVar22) & 0x3f800000);
      fVar23 = fVar23 - (float)(-(uint)(fVar19 < fVar23) & 0x3f800000);
      fVar13 = auVar12._0_4_ - fVar20 * 0.6931472;
      fVar17 = auVar12._4_4_ - fVar21 * 0.6931472;
      fVar18 = auVar12._8_4_ - fVar22 * 0.6931472;
      fVar19 = auVar12._12_4_ - fVar23 * 0.6931472;
      auVar16._0_4_ =
           (float)((int)fVar20 * 0x800000 + 0x3f800000) *
           (fVar13 + 1.0 +
           (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) * fVar13 +
             0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5) * fVar13 * fVar13) + 1.0;
      auVar16._4_4_ =
           (float)((int)fVar21 * 0x800000 + 0x3f800000) *
           (fVar17 + 1.0 +
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17) + 1.0;
      auVar16._8_4_ =
           (float)((int)fVar22 * 0x800000 + 0x3f800000) *
           (fVar18 + 1.0 +
           (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
             0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5) * fVar18 * fVar18) + 1.0;
      auVar16._12_4_ =
           (float)((int)fVar23 * 0x800000 + 0x3f800000) *
           (fVar19 + 1.0 +
           (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
             0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) * fVar19 * fVar19) + 1.0;
      auVar12 = divps(_DAT_00538230,auVar16);
      *(float *)*pauVar6 = (auVar12._0_4_ + -1.0) * auVar1._0_4_;
      *(float *)(*pauVar6 + 4) = (auVar12._4_4_ + -1.0) * auVar1._4_4_;
      *(float *)(*pauVar6 + 8) = (auVar12._8_4_ + -1.0) * auVar1._8_4_;
      *(float *)(*pauVar6 + 0xc) = (auVar12._12_4_ + -1.0) * auVar1._12_4_;
      pauVar6 = pauVar6 + 1;
      lVar9 = lVar9 + 4;
    }
    lVar5 = sVar4 * sVar3 * uVar11;
    for (; (int)lVar9 < iVar7; lVar9 = lVar9 + 1) {
      fVar13 = *(float *)((long)pvVar2 + lVar9 * 4 + lVar5);
      fVar17 = expf(fVar13);
      fVar17 = logf(fVar17 + 1.0);
      fVar17 = tanhf(fVar17);
      *(float *)((long)pvVar2 + lVar9 * 4 + lVar5) = fVar17 * fVar13;
    }
  }
  return 0;
}

Assistant:

int Mish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = mish_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}